

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O0

void nes_defchr(int *ip)

{
  char last_char;
  int iVar1;
  int local_50;
  int i;
  int size;
  uint data [8];
  uchar buffer [16];
  int *ip_local;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 3;
  data_level = 3;
  local_50 = 0;
  while( true ) {
    if (7 < local_50) {
      iVar1 = nes_pack_8x8_tile((uchar *)(data + 6),&i,0,2);
      putbuffer(data + 6,iVar1);
      if (pass == 1) {
        println();
      }
      return;
    }
    last_char = ';';
    if (local_50 < 7) {
      last_char = ',';
    }
    iVar1 = evaluate(ip,last_char);
    if (iVar1 == 0) break;
    (&i)[local_50] = value;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void
nes_defchr(int *ip)
{
	unsigned char buffer[16];
	unsigned int data[8];
	int size;
	int i;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 3;
	data_level  = 3;

	/* get tile data */
	for (i = 0; i < 8; i++) {
		/* get value */
		if (!evaluate(ip, (i < 7) ? ',' : ';'))
			return;

		/* store value */
		data[i] = value;
	}

	/* encode tile */
	size = nes_pack_8x8_tile(buffer, data, 0, PACKED_TILE);

	/* store tile */
	putbuffer(buffer, size);

	/* output line */
	if (pass == LAST_PASS)
		println();
}